

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O2

bool __thiscall rsg::Token::operator!=(Token *this,Token *other)

{
  bool bVar1;
  deBool dVar2;
  Type TVar3;
  
  TVar3 = this->m_type;
  if (TVar3 != other->m_type) {
    return false;
  }
  if (TVar3 == IDENTIFIER) {
    dVar2 = deStringEqual((this->m_arg).identifier,(other->m_arg).identifier);
    if (dVar2 != 0) {
      TVar3 = this->m_type;
      goto LAB_0093a7cc;
    }
LAB_0093a7e9:
    bVar1 = false;
  }
  else {
LAB_0093a7cc:
    if (TVar3 == BOOL_LITERAL) {
      if ((this->m_arg).boolValue != (other->m_arg).boolValue) goto LAB_0093a7e9;
    }
    else if (TVar3 == INT_LITERAL) {
      if ((this->m_arg).intValue != (other->m_arg).intValue) goto LAB_0093a7e9;
    }
    else if (TVar3 == FLOAT_LITERAL) {
      if (((this->m_arg).floatValue != (other->m_arg).floatValue) ||
         (NAN((this->m_arg).floatValue) || NAN((other->m_arg).floatValue))) goto LAB_0093a7e9;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Token::operator!= (const Token& other) const
{
	if (m_type != other.m_type)
		return false;

	if (m_type == IDENTIFIER && !deStringEqual(m_arg.identifier, other.m_arg.identifier))
		return false;
	else if (m_type == FLOAT_LITERAL && m_arg.floatValue != other.m_arg.floatValue)
		return false;
	else if (m_type == INT_LITERAL && m_arg.intValue != other.m_arg.intValue)
		return false;
	else if (m_type == BOOL_LITERAL && m_arg.boolValue != other.m_arg.boolValue)
		return false;

	return true;
}